

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::BamStandardIndex
          (BamStandardIndex *this,BamReaderPrivate *reader)

{
  bool bVar1;
  undefined8 *in_RDI;
  BamReaderPrivate *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  BamIndex::BamIndex((BamIndex *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__BamStandardIndex_00210818;
  std::
  vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
  ::vector((vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
            *)0x1b43e3);
  *(undefined4 *)(in_RDI + 10) = 0;
  RaiiWrapper::RaiiWrapper((RaiiWrapper *)(in_RDI + 0xb));
  bVar1 = SystemIsBigEndian();
  *(bool *)(in_RDI + 6) = bVar1;
  return;
}

Assistant:

BamStandardIndex::BamStandardIndex(Internal::BamReaderPrivate* reader)
    : BamIndex(reader)
    , m_bufferLength(0)
{
     m_isBigEndian = BamTools::SystemIsBigEndian();
}